

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_node.cpp
# Opt level: O2

fe_im * get_image(fe_im *__return_storage_ptr__,fe_node *node,fe_args *args)

{
  free_image_fn *pp_Var1;
  uint8_t **ppuVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  int iVar8;
  uint8_t *puVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int iVar12;
  FE_IMAGE_FORMAT FVar13;
  undefined4 uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  fe_im_cache *pfVar19;
  
  pfVar19 = (args->cache).images;
  if ((pfVar19 == (fe_im_cache *)0x0) || (pfVar19[node->index].image.image.data == (uint8_t *)0x0))
  {
    (*node->get_image)(__return_storage_ptr__,node,args);
    uVar4 = node->x;
    uVar6 = node->y;
    fVar3 = args->scale;
    uVar5 = __return_storage_ptr__->x;
    uVar7 = __return_storage_ptr__->y;
    __return_storage_ptr__->x = uVar5 + (int)(fVar3 * (float)(int)uVar4);
    __return_storage_ptr__->y = uVar7 + (int)(fVar3 * (float)(int)uVar6);
    if (pfVar19 == (fe_im_cache *)0x0) {
      return __return_storage_ptr__;
    }
    iVar8 = node->index;
    iVar12 = (__return_storage_ptr__->image).w;
    iVar15 = (__return_storage_ptr__->image).h;
    iVar16 = (__return_storage_ptr__->image).pitch;
    iVar17 = (__return_storage_ptr__->image).bytespp;
    puVar9 = (__return_storage_ptr__->image).data;
    uVar10 = *(undefined8 *)&(__return_storage_ptr__->image).format;
    uVar11 = *(undefined8 *)&__return_storage_ptr__->x;
    pp_Var1 = &pfVar19[iVar8].image.image.free;
    *pp_Var1 = (__return_storage_ptr__->image).free;
    pp_Var1[1] = (free_image_fn)uVar11;
    ppuVar2 = &pfVar19[iVar8].image.image.data;
    *ppuVar2 = puVar9;
    ppuVar2[1] = (uint8_t *)uVar10;
    pfVar19 = pfVar19 + iVar8;
    (pfVar19->image).image.w = iVar12;
    (pfVar19->image).image.h = iVar15;
    (pfVar19->image).image.pitch = iVar16;
    (pfVar19->image).image.bytespp = iVar17;
  }
  else {
    pfVar19 = pfVar19 + node->index;
    iVar15 = (pfVar19->image).image.w;
    iVar16 = (pfVar19->image).image.h;
    iVar17 = (pfVar19->image).image.pitch;
    iVar18 = (pfVar19->image).image.bytespp;
    puVar9 = (pfVar19->image).image.data;
    FVar13 = (pfVar19->image).image.format;
    uVar14 = *(undefined4 *)&(pfVar19->image).image.field_0x1c;
    iVar8 = (pfVar19->image).x;
    iVar12 = (pfVar19->image).y;
    (__return_storage_ptr__->image).free = (pfVar19->image).image.free;
    __return_storage_ptr__->x = iVar8;
    __return_storage_ptr__->y = iVar12;
    (__return_storage_ptr__->image).data = puVar9;
    (__return_storage_ptr__->image).format = FVar13;
    *(undefined4 *)&(__return_storage_ptr__->image).field_0x1c = uVar14;
    (__return_storage_ptr__->image).w = iVar15;
    (__return_storage_ptr__->image).h = iVar16;
    (__return_storage_ptr__->image).pitch = iVar17;
    (__return_storage_ptr__->image).bytespp = iVar18;
  }
  (__return_storage_ptr__->image).free = (free_image_fn)0x0;
  return __return_storage_ptr__;
}

Assistant:

fe_im get_image(const fe_node* node, const fe_args* args)
{
    fe_im_cache *cached = args->cache.images;
    if (cached && cached[node->index].image.image.data)
    {
        fe_im res = cached[node->index].image;
        res.image.free = 0;
        return res;
    }
    

    fe_im r = node->get_image(node, args);

    r.x += static_cast<int>(node->x * args->scale);
    r.y += static_cast<int>(node->y * args->scale);

#ifdef SAVE_NODES
    char str[255];
    sprintf(str, "../temp/%d.tga", node->id);
    fe_image_save_tga(&r.image, str);
#endif

    if (cached)
    {
        cached[node->index].image = r;
        r.image.free = 0;
    }

    return r;
}